

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O3

void Gia_ManFromBridgeTest(char *pFileName)

{
  FILE *__stream;
  Gia_Man_t *p;
  
  __stream = fopen(pFileName,"rb");
  if (__stream != (FILE *)0x0) {
    p = Gia_ManFromBridge((FILE *)__stream,(Vec_Int_t **)0x0);
    fclose(__stream);
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
    Gia_AigerWrite(p,"temp.aig",0,0);
    Gia_ManToBridgeAbsNetlistTest("par_.dump",p,0x6b);
    Gia_ManStop(p);
    return;
  }
  printf("Cannot open input file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_ManFromBridgeTest( char * pFileName )
{
    Gia_Man_t * p;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return;
    }

    p = Gia_ManFromBridge( pFile, NULL );
    fclose ( pFile );

    Gia_ManPrintStats( p, NULL );
    Gia_AigerWrite( p, "temp.aig", 0, 0 );

    Gia_ManToBridgeAbsNetlistTest( "par_.dump", p, BRIDGE_ABS_NETLIST );
    Gia_ManStop( p );
}